

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int __thiscall Pathie::Path::rename(Path *this,char *__old,char *__new)

{
  int iVar1;
  char *__old_00;
  char *__new_00;
  ErrnoError *this_00;
  int *piVar2;
  undefined1 local_58 [8];
  string newname_nstr;
  undefined1 local_38 [8];
  string nstr;
  Path *newname_local;
  Path *this_local;
  
  native_abi_cxx11_((Path *)local_38);
  native_abi_cxx11_((Path *)local_58);
  __old_00 = (char *)std::__cxx11::string::c_str();
  __new_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::rename(__old_00,__new_00);
  if (iVar1 != 0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  std::__cxx11::string::~string((string *)local_58);
  iVar1 = std::__cxx11::string::~string((string *)local_38);
  return iVar1;
}

Assistant:

void Path::rename(Path& newname) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  std::string newname_nstr = newname.native();

  if (::rename(nstr.c_str(), newname_nstr.c_str()) != 0)
    throw Pathie::ErrnoError(errno);
#elif defined(_WIN32)
  std::wstring utf16_oldname = utf8_to_utf16(m_path);
  std::wstring utf16_newname = utf8_to_utf16(newname.m_path);

  if (_wrename(utf16_oldname.c_str(), utf16_newname.c_str()) != 0)
    throw Pathie::ErrnoError(errno);
#else
#error Unsupported system.
#endif
}